

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void dw3_hero(dw_rom *rom)

{
  ulong in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  ulong in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  ulong in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  ulong in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  ulong in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  ulong in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  ulong in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  ulong in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  ulong in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  ulong in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  ulong in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  ulong in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  ulong in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  ulong in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  ulong in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  ulong in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  ulong in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  ulong in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  ulong in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  ulong in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  ulong in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ulong in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  ulong in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  ulong in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ulong in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ulong in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  ulong in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  ulong in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  ulong in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  ulong in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,in_stack_fffffffffffffd68 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd70 >> 0x20),0x52),
         in_stack_fffffffffffffd78 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),0x53),
         in_stack_fffffffffffffd88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd90 >> 0x20),0x54),
         in_stack_fffffffffffffd98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffda0 >> 0x20),0x55),
         in_stack_fffffffffffffda8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),0x56),
         in_stack_fffffffffffffdb8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),0x57),
         in_stack_fffffffffffffdc8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),0x50),
         in_stack_fffffffffffffdd8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),0x51),
         in_stack_fffffffffffffde8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),0x52),
         in_stack_fffffffffffffdf8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),0x53),
         in_stack_fffffffffffffe08 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe10 >> 0x20),0x54),
         in_stack_fffffffffffffe18 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),0x55),
         in_stack_fffffffffffffe28 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe30 >> 0x20),0x56),
         in_stack_fffffffffffffe38 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),0x57),
         in_stack_fffffffffffffe48 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),0x50),
         in_stack_fffffffffffffe58 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),0x51),
         in_stack_fffffffffffffe68 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),0x52),
         in_stack_fffffffffffffe78 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),0x53),
         in_stack_fffffffffffffe88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),0x54),
         in_stack_fffffffffffffe98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),0x55),
         in_stack_fffffffffffffea8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),0x56),
         in_stack_fffffffffffffeb8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),0x57),
         in_stack_fffffffffffffec8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),0x50),
         in_stack_fffffffffffffed8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),0x51),
         in_stack_fffffffffffffee8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),0x52),
         in_stack_fffffffffffffef8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),0x53),
         in_stack_ffffffffffffff08 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),0x54),
         in_stack_ffffffffffffff18 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),0x55),
         in_stack_ffffffffffffff28 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),0x56),
         in_stack_ffffffffffffff38 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),0x57),
         in_stack_ffffffffffffff48 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),0x50));
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x80,3,6,0xe,0xd,0x11,0xf,0xf,0x3f,0x23,0x46,0x4f,0x4f,0x9f,0x9a,0x82,0xb8,0x70
         ,0xe4,0x7c,0xbc,0x88,0xf0,0xf0,0xee,0x70,0xe4,0xfc,0xfc,0xf8,0x58,0x4e,0x1f,0x79,0xee,0xef,
         0x22,0x53,0x5f,0x9f,0xf,0xff,0xdf,0x3f,0x3d,0x7f,0x61,0xe0,0,0xee,0x6e,0x8e,0x6e,0xf0,0xfa,
         0x71,0,0xf5,0xfb,0xf9,0x9f,0xfe,0xfe,0x8f,0,3);
  vpatch(rom,0x12401,0x17f,5,7,0xb,8,0xf,1,0xe,0x22,0x45,0x4f,0x4f,0x8f,0x84,0x8e,0x9f,0xc0,0xb8,
         0xf0,0xf4,0x78,0x98,0xe0,0xf0,0xc0,0xb8,0xf0,0xf4,0xf8,0x78,0x30,0x50,0x2e,0xee,0xee,0xce,1
         ,7,0xf,7,0xb5,0xfb,0x39,0x1f,0xf,7,1,0,0x30,0xb8,0x5c,0x98,0xe6,0xee,0xb6,0x81,0xf0,0xf0,
         0xf0,0x7c,0xf8,0xfc,0x8e,7,2,5);
  return;
}

Assistant:

static void dw3_hero(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  128,  0x03,  0x06,  0x0e,  0x0d,  0x11,  0x0f,  0x0f,  0x3f,  0x23,  0x46,  0x4f,  0x4f,  0x9f,  0x9a,  0x82,  0xb8,  0x70,  0xe4,  0x7c,  0xbc,  0x88,  0xf0,  0xf0,  0xee,  0x70,  0xe4,  0xfc,  0xfc,  0xf8,  0x58,  0x4e,  0x1f,  0x79,  0xee,  0xef,  0x22,  0x53,  0x5f,  0x9f,  0x0f,  0xff,  0xdf,  0x3f,  0x3d,  0x7f,  0x61,  0xe0,  0x00,  0xee,  0x6e,  0x8e,  0x6e,  0xf0,  0xfa,  0x71,  0x00,  0xf5,  0xfb,  0xf9,  0x9f,  0xfe,  0xfe,  0x8f,  0x00,  0x03,  0x06,  0x0e,  0x0d,  0x11,  0x0f,  0x0f,  0x1f,  0x0b,  0x16,  0x1f,  0x1f,  0x3f,  0x3a,  0x22,  0x38,  0x70,  0xe4,  0x7c,  0xbc,  0x88,  0xf0,  0xf0,  0xfb,  0x70,  0xe4,  0xfc,  0xfc,  0xf8,  0x58,  0x43,  0x1f,  0x19,  0x7e,  0x6f,  0x62,  0x53,  0x5f,  0x8e,  0x00,  0x3f,  0x7f,  0x1f,  0x1d,  0x7f,  0x7f,  0xf1,  0x00,  0xfb,  0x7b,  0x93,  0x73,  0xfc,  0xfa,  0xf9,  0xf0,  0xfd,  0xfe,  0xfe,  0x8f,  0xff,  0x86,  0x07,  0x00);
    vpatch(rom, 0x12401,  383,  0x05,  0x07,  0x0b,  0x08,  0x0f,  0x01,  0x0e,  0x22,  0x45,  0x4f,  0x4f,  0x8f,  0x84,  0x8e,  0x9f,  0xc0,  0xb8,  0xf0,  0xf4,  0x78,  0x98,  0xe0,  0xf0,  0xc0,  0xb8,  0xf0,  0xf4,  0xf8,  0x78,  0x30,  0x50,  0x2e,  0xee,  0xee,  0xce,  0x01,  0x07,  0x0f,  0x07,  0xb5,  0xfb,  0x39,  0x1f,  0x0f,  0x07,  0x01,  0x00,  0x30,  0xb8,  0x5c,  0x98,  0xe6,  0xee,  0xb6,  0x81,  0xf0,  0xf0,  0xf0,  0x7c,  0xf8,  0xfc,  0x8e,  0x07,  0x02,  0x05,  0x07,  0x0b,  0x08,  0x0f,  0x0f,  0x37,  0x0a,  0x15,  0x1f,  0x1f,  0x2f,  0x24,  0x34,  0x38,  0xc0,  0xb8,  0xf0,  0xf4,  0x78,  0x98,  0xe0,  0xf0,  0xc0,  0xb8,  0xf0,  0xf4,  0xf8,  0x78,  0x30,  0x50,  0x37,  0x71,  0x76,  0x73,  0x0f,  0x1f,  0x0c,  0x01,  0x2f,  0x5f,  0x0f,  0x3c,  0x3f,  0x07,  0x00,  0x00,  0x30,  0xb8,  0x5c,  0x98,  0xe6,  0xee,  0xf6,  0xf1,  0xf0,  0xf0,  0xf0,  0x7c,  0xf8,  0xfc,  0xfe,  0x07,  0x02,  0x1d,  0x0f,  0x2f,  0x1e,  0x19,  0x07,  0x0f,  0x03,  0x1d,  0x0f,  0x2f,  0x1f,  0x1e,  0x0c,  0x0a,  0x40,  0x20,  0x60,  0x50,  0x10,  0xb0,  0xb0,  0xa0,  0x40,  0xa0,  0xf0,  0xf0,  0xf0,  0x60,  0x60,  0x40,  0x1c,  0x35,  0x23,  0x19,  0x37,  0x37,  0x6d,  0x81,  0x0f,  0x0f,  0x1f,  0x3e,  0x3f,  0x3f,  0x71,  0xe0,  0x20,  0xd0,  0xe0,  0xe0,  0x30,  0xe0,  0xf0,  0xe0,  0xe0,  0xf0,  0x30,  0x10,  0xf0,  0xe0,  0x80,  0x00,  0x02,  0x1d,  0x0f,  0x2f,  0x1e,  0x19,  0x07,  0x0f,  0x03,  0x1d,  0x0f,  0x2f,  0x1f,  0x1e,  0x0c,  0x0a,  0x40,  0xa0,  0xe0,  0xd0,  0x10,  0xf0,  0xf0,  0xe0,  0x50,  0xa8,  0xf8,  0xf8,  0xf4,  0x24,  0x24,  0x04,  0x1c,  0x35,  0x23,  0x19,  0x37,  0x37,  0x6f,  0x8f,  0x0f,  0x0f,  0x1f,  0x3e,  0x3f,  0x3f,  0x7f,  0xe0,  0x60,  0x9c,  0xec,  0x2c,  0x30,  0xf8,  0x30,  0x80,  0xe4,  0xfc,  0xf0,  0xd0,  0xf0,  0xe0,  0x00,  0x00,  0x0e,  0x27,  0x3f,  0x3f,  0x1f,  0x07,  0x18,  0x2f,  0x0e,  0x27,  0x3f,  0x3f,  0x1f,  0x1f,  0x7f,  0xdf,  0x80,  0x40,  0xe0,  0xe0,  0xf0,  0xc0,  0x30,  0xe0,  0x84,  0x42,  0xe2,  0xe2,  0xf1,  0xf1,  0xf1,  0xc1,  0x37,  0x6f,  0x37,  0x3f,  0x3f,  0x7f,  0x7f,  0xfc,  0xd9,  0xfe,  0xfc,  0xf8,  0x71,  0x63,  0x67,  0xff,  0x70,  0xbb,  0xf9,  0xe3,  0x1e,  0xfc,  0x0c,  0xf6,  0xb9,  0xff,  0x7e,  0xfc,  0xfe,  0xfc,  0xfc,  0x0e,  0x0e,  0x27,  0x3f,  0x3f,  0x1f,  0x07,  0x18,  0xaf,  0x0e,  0x27,  0x3f,  0x3f,  0x1f,  0x1f,  0x9f,  0xff,  0x80,  0x40,  0xe0,  0xe0,  0xf0,  0xc0,  0x30,  0xe0,  0xa0,  0x50,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0xc8,  0x97,  0xaf,  0xb7,  0xbf,  0x3f,  0x7f,  0x61,  0xde,  0x79,  0xfe,  0x7c,  0xf8,  0xb1,  0x63,  0x7f,  0xe1,  0x60,  0xbc,  0xf4,  0xec,  0x18,  0xfc,  0xfc,  0x7e,  0xb8,  0xfc,  0x78,  0xf8,  0xf8,  0xfc,  0xfc,  0xfe);
}